

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O0

QString * QSqlQueryModelSql::leftJoin(QString *s)

{
  long lVar1;
  QLatin1StringView latin1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QString *in_stack_ffffffffffffffe0;
  QString *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = leftJoin();
  latin1.m_data = (char *)in_stack_ffffffffffffffe8;
  latin1.m_size = (qsizetype)in_stack_ffffffffffffffe0;
  QString::QString((QString *)QVar2.m_size,latin1);
  concat(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  QString::~QString((QString *)0x15e132);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString leftJoin(const QString &s) { return concat(leftJoin(), s); }